

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

size_t stbds_siphash_bytes(void *p,size_t len,size_t seed)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong local_60;
  size_t data;
  size_t v3;
  size_t v2;
  size_t v1;
  size_t v0;
  size_t j;
  size_t i;
  uchar *d;
  size_t seed_local;
  size_t len_local;
  void *p_local;
  
  v1 = seed ^ 0x736f6d6570736575;
  v2 = seed ^ 0x9b908d9e919b9092;
  v3 = seed ^ 0x6c7967656e657261;
  data = seed ^ 0x8b9a9b9d868b9a8c;
  i = (size_t)p;
  for (j = 0; j + 8 <= len; j = j + 8) {
    uVar2 = (long)*(int *)(i + 4) << 0x20 | (long)*(int *)i;
    data = uVar2 ^ data;
    bVar1 = false;
    while (!bVar1) {
      uVar3 = v2 + v1;
      uVar4 = uVar3 ^ (v2 << 0xd | v2 >> 0x33);
      uVar5 = data + v3 ^ (data << 0x10 | data >> 0x30);
      uVar6 = uVar4 + data + v3;
      v2 = uVar6 ^ (uVar4 << 0x11 | uVar4 >> 0x2f);
      v3 = uVar6 << 0x20 | uVar6 >> 0x20;
      v1 = uVar5 + (uVar3 << 0x20 | uVar3 >> 0x20);
      data = v1 ^ (uVar5 << 0x15 | uVar5 >> 0x2b);
      bVar1 = true;
    }
    v1 = uVar2 ^ v1;
    i = i + 8;
  }
  local_60 = len << 0x38;
  switch(len - j) {
  case 7:
    local_60 = (ulong)*(byte *)(i + 6) << 0x30 | local_60;
  case 6:
    local_60 = (ulong)*(byte *)(i + 5) << 0x28 | local_60;
  case 5:
    local_60 = (ulong)*(byte *)(i + 4) << 0x20 | local_60;
  case 4:
    local_60 = (long)(int)((uint)*(byte *)(i + 3) << 0x18) | local_60;
  case 3:
    local_60 = (long)(int)((uint)*(byte *)(i + 2) << 0x10) | local_60;
  case 2:
    local_60 = (long)(int)((uint)*(byte *)(i + 1) << 8) | local_60;
  case 1:
    local_60 = *(byte *)i | local_60;
  case 0:
  default:
    data = local_60 ^ data;
    bVar1 = false;
    while (!bVar1) {
      uVar2 = v2 + v1;
      uVar3 = uVar2 ^ (v2 << 0xd | v2 >> 0x33);
      uVar4 = data + v3 ^ (data << 0x10 | data >> 0x30);
      uVar5 = uVar3 + data + v3;
      v2 = uVar5 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
      v3 = uVar5 << 0x20 | uVar5 >> 0x20;
      v1 = uVar4 + (uVar2 << 0x20 | uVar2 >> 0x20);
      data = v1 ^ (uVar4 << 0x15 | uVar4 >> 0x2b);
      bVar1 = true;
    }
    v1 = local_60 ^ v1;
    v3 = v3 ^ 0xff;
    bVar1 = false;
    while (!bVar1) {
      uVar2 = v2 + v1;
      uVar3 = uVar2 ^ (v2 << 0xd | v2 >> 0x33);
      uVar4 = data + v3 ^ (data << 0x10 | data >> 0x30);
      uVar5 = uVar3 + data + v3;
      v2 = uVar5 ^ (uVar3 << 0x11 | uVar3 >> 0x2f);
      v3 = uVar5 << 0x20 | uVar5 >> 0x20;
      v1 = uVar4 + (uVar2 << 0x20 | uVar2 >> 0x20);
      data = v1 ^ (uVar4 << 0x15 | uVar4 >> 0x2b);
      bVar1 = true;
    }
    return v2 ^ v3 ^ data;
  }
}

Assistant:

static size_t stbds_siphash_bytes(void *p, size_t len, size_t seed)
{
  unsigned char *d = (unsigned char *) p;
  size_t i,j;
  size_t v0,v1,v2,v3, data;

  // hash that works on 32- or 64-bit registers without knowing which we have
  // (computes different results on 32-bit and 64-bit platform)
  // derived from siphash, but on 32-bit platforms very different as it uses 4 32-bit state not 4 64-bit
  v0 = ((((size_t) 0x736f6d65 << 16) << 16) + 0x70736575) ^  seed;
  v1 = ((((size_t) 0x646f7261 << 16) << 16) + 0x6e646f6d) ^ ~seed;
  v2 = ((((size_t) 0x6c796765 << 16) << 16) + 0x6e657261) ^  seed;
  v3 = ((((size_t) 0x74656462 << 16) << 16) + 0x79746573) ^ ~seed;

  #ifdef STBDS_TEST_SIPHASH_2_4
  // hardcoded with key material in the siphash test vectors
  v0 ^= 0x0706050403020100ull ^  seed;
  v1 ^= 0x0f0e0d0c0b0a0908ull ^ ~seed;
  v2 ^= 0x0706050403020100ull ^  seed;
  v3 ^= 0x0f0e0d0c0b0a0908ull ^ ~seed;
  #endif

  #define STBDS_SIPROUND() \
    do {                   \
      v0 += v1; v1 = STBDS_ROTATE_LEFT(v1, 13);  v1 ^= v0; v0 = STBDS_ROTATE_LEFT(v0,STBDS_SIZE_T_BITS/2); \
      v2 += v3; v3 = STBDS_ROTATE_LEFT(v3, 16);  v3 ^= v2;                                                 \
      v2 += v1; v1 = STBDS_ROTATE_LEFT(v1, 17);  v1 ^= v2; v2 = STBDS_ROTATE_LEFT(v2,STBDS_SIZE_T_BITS/2); \
      v0 += v3; v3 = STBDS_ROTATE_LEFT(v3, 21);  v3 ^= v0;                                                 \
    } while (0)

  for (i=0; i+sizeof(size_t) <= len; i += sizeof(size_t), d += sizeof(size_t)) {
    data = d[0] | (d[1] << 8) | (d[2] << 16) | (d[3] << 24);
    data |= (size_t) (d[4] | (d[5] << 8) | (d[6] << 16) | (d[7] << 24)) << 16 << 16; // discarded if size_t == 4

    v3 ^= data;
    for (j=0; j < STBDS_SIPHASH_C_ROUNDS; ++j)
      STBDS_SIPROUND();
    v0 ^= data;
  }
  data = len << (STBDS_SIZE_T_BITS-8);
  switch (len - i) {
    case 7: data |= ((size_t) d[6] << 24) << 24; // fall through
    case 6: data |= ((size_t) d[5] << 20) << 20; // fall through
    case 5: data |= ((size_t) d[4] << 16) << 16; // fall through
    case 4: data |= (d[3] << 24); // fall through
    case 3: data |= (d[2] << 16); // fall through
    case 2: data |= (d[1] << 8); // fall through
    case 1: data |= d[0]; // fall through
    case 0: break;
  }
  v3 ^= data;
  for (j=0; j < STBDS_SIPHASH_C_ROUNDS; ++j)
    STBDS_SIPROUND();
  v0 ^= data;
  v2 ^= 0xff;
  for (j=0; j < STBDS_SIPHASH_D_ROUNDS; ++j)
    STBDS_SIPROUND();

#ifdef STBDS_SIPHASH_2_4
  return v0^v1^v2^v3;
#else
  return v1^v2^v3; // slightly stronger since v0^v3 in above cancels out final round operation? I tweeted at the authors of SipHash about this but they didn't reply
#endif
}